

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O0

void __thiscall TSPStateImp::InitData(TSPStateImp *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  int local_20;
  int local_1c;
  int j_1;
  int i_1;
  int j;
  int i;
  TSPStateImp *this_local;
  
  std::istream::operator>>((istream *)&std::cin,&this->n);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->n;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  this->x = pdVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->n;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  this->y = pdVar5;
  for (i_1 = 0; i_1 < this->n; i_1 = i_1 + 1) {
    std::istream::operator>>((istream *)&std::cin,this->x + i_1);
  }
  for (j_1 = 0; j_1 < this->n; j_1 = j_1 + 1) {
    std::istream::operator>>((istream *)&std::cin,this->y + j_1);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(this->n * this->n);
  uVar4 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  this->adjacencyMatrix = pdVar5;
  for (local_1c = 0; local_1c < this->n; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < this->n; local_20 = local_20 + 1) {
      dVar6 = sqrt((this->x[local_1c] - this->x[local_20]) * (this->x[local_1c] - this->x[local_20])
                   + (this->y[local_1c] - this->y[local_20]) *
                     (this->y[local_1c] - this->y[local_20]));
      this->adjacencyMatrix[local_1c * this->n + local_20] = dVar6;
    }
  }
  return;
}

Assistant:

void TSPStateImp::InitData()
{
	std::cin >> n;
	x = new double[n];
	y = new double[n];

	for (int i = 0; i < n; ++i)
		std::cin >> x[i];

	for (int j = 0; j < n; ++j)
		std::cin >> y[j];

	adjacencyMatrix = new double[n * n];

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < n; ++j)
			adjacencyMatrix[i * n + j] = sqrt((x[i] - x[j]) * (x[i] - x[j]) + (y[i] - y[j]) * (y[i] - y[j]));
}